

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

bool __thiscall Am_Inter_Location::Translate_To(Am_Inter_Location *this,Am_Object *dest_obj)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Am_Inter_Location_Data *pAVar4;
  
  iVar3 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
  pAVar4 = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar3);
  this->data = pAVar4;
  if (pAVar4 != (Am_Inter_Location_Data *)0x0) {
    bVar1 = Am_Object::operator!=(&pAVar4->ref_obj,dest_obj);
    bVar2 = true;
    if (bVar1) {
      pAVar4 = this->data;
      bVar2 = Am_Translate_Coordinates
                        (&pAVar4->ref_obj,(pAVar4->data).rect.left,(pAVar4->data).rect.top,dest_obj,
                         (int *)&pAVar4->data,&(pAVar4->data).rect.top);
      pAVar4 = this->data;
      if (pAVar4->as_line == true) {
        Am_Translate_Coordinates
                  (&pAVar4->ref_obj,(pAVar4->data).rect.width,(pAVar4->data).rect.height,dest_obj,
                   &(pAVar4->data).rect.width,&(pAVar4->data).rect.height);
      }
      Am_Object::operator=(&this->data->ref_obj,dest_obj);
    }
    return bVar2;
  }
  Am_Error("Am_Inter_Location not initialized");
}

Assistant:

bool
Am_Inter_Location::Translate_To(Am_Object dest_obj)
{
  data = (Am_Inter_Location_Data *)data->Make_Unique();
  bool ok = true;
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (data->ref_obj != dest_obj) {
    ok = Am_Translate_Coordinates(data->ref_obj, data->data.line.x1,
                                  data->data.line.y1, dest_obj,
                                  data->data.line.x1, data->data.line.y1);
    if (data->as_line)
      Am_Translate_Coordinates(data->ref_obj, data->data.line.x2,
                               data->data.line.y2, dest_obj, data->data.line.x2,
                               data->data.line.y2);
    data->ref_obj = dest_obj;
  }
  return ok;
}